

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O0

vector<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_> *
libtorrent::aux::parse_listen_interfaces
          (vector<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
           *__return_storage_ptr__,string *in,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *err)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  const_reference pvVar4;
  ulong uVar5;
  char *__nptr;
  const_iterator pvVar6;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char in_R8B;
  string_view in_00;
  string_view in_01;
  string_view in_02;
  string_view in_03;
  string_view in_04;
  undefined1 auVar7 [16];
  string_view sVar8;
  basic_string_view<char,_std::char_traits<char>_> bVar9;
  string_view last;
  bool local_281;
  value_type c;
  const_iterator __end3;
  const_iterator __begin3;
  string_view *__range3;
  size_t local_1d0;
  char *local_1c8;
  ulong local_1c0;
  size_t i;
  string port_str;
  size_t local_188;
  char *local_180;
  string_view local_168;
  size_type local_158;
  size_type pos_1;
  char *local_148;
  string_view local_140;
  basic_string_view<char,_std::char_traits<char>_> local_130;
  string_view local_120;
  undefined4 local_10c;
  size_type local_108;
  size_type pos;
  string_view port;
  listen_interface_t iface;
  size_t local_a8;
  char *local_a0;
  basic_string_view<char,_std::char_traits<char>_> local_98 [2];
  char *local_78;
  size_t sStack_70;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_68;
  undefined1 local_48 [8];
  string_view element;
  string_view rest;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *err_local;
  string *in_local;
  vector<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
  *out;
  
  ::std::
  vector<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
  ::vector((vector<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
            *)__return_storage_ptr__);
  auVar7 = ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)in);
  last._M_len = auVar7._8_8_;
  element._M_str = auVar7._0_8_;
  do {
    do {
      bVar1 = ::std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)&element._M_str);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        return __return_storage_ptr__;
      }
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)local_48);
      local_78 = element._M_str;
      last._M_str = (char *)0x2c;
      sStack_70 = last._M_len;
      split_string_quotes(&local_68,(aux *)element._M_str,last,in_R8B);
      ::std::
      tie<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                (local_98,(basic_string_view<char,_std::char_traits<char>_> *)local_48);
      ::std::
      tuple<std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
      ::operator=((tuple<std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
                   *)local_98,
                  (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                   *)&local_68);
      sVar8._M_str = extraout_RDX;
      sVar8._M_len = element._M_len;
      sVar8 = strip_string((aux *)local_48,sVar8);
      local_a8 = sVar8._M_len;
      local_48 = (undefined1  [8])local_a8;
      local_a0 = sVar8._M_str;
      element._M_len = (size_t)local_a0;
      sVar3 = ::std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_48);
      bVar9._M_str = (char *)element._M_len;
      bVar9._M_len = (size_t)local_48;
      if (1 < sVar3) {
        pvVar4 = ::std::basic_string_view<char,_std::char_traits<char>_>::front
                           ((basic_string_view<char,_std::char_traits<char>_> *)local_48);
        bVar9._M_str = (char *)element._M_len;
        bVar9._M_len = (size_t)local_48;
        if (*pvVar4 == '\"') {
          pvVar4 = ::std::basic_string_view<char,_std::char_traits<char>_>::back
                             ((basic_string_view<char,_std::char_traits<char>_> *)local_48);
          bVar9._M_str = (char *)element._M_len;
          bVar9._M_len = (size_t)local_48;
          if (*pvVar4 == '\"') {
            sVar3 = ::std::basic_string_view<char,_std::char_traits<char>_>::size
                              ((basic_string_view<char,_std::char_traits<char>_> *)local_48);
            bVar9 = ::std::basic_string_view<char,_std::char_traits<char>_>::substr
                              ((basic_string_view<char,_std::char_traits<char>_> *)local_48,1,
                               sVar3 - 2);
          }
        }
      }
      element._M_len = (size_t)bVar9._M_str;
      local_48 = (undefined1  [8])bVar9._M_len;
      bVar1 = ::std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_48);
    } while (bVar1);
    listen_interface_t::listen_interface_t((listen_interface_t *)&port._M_str);
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&pos);
    pvVar4 = ::std::basic_string_view<char,_std::char_traits<char>_>::front
                       ((basic_string_view<char,_std::char_traits<char>_> *)local_48);
    if (*pvVar4 == '[') {
      local_108 = ::std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                            ((basic_string_view<char,_std::char_traits<char>_> *)local_48,']',0);
      if (local_108 != 0xffffffffffffffff) {
        uVar5 = local_108 + 1;
        sVar3 = ::std::basic_string_view<char,_std::char_traits<char>_>::size
                          ((basic_string_view<char,_std::char_traits<char>_> *)local_48);
        if (uVar5 < sVar3) {
          pvVar4 = ::std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                             ((basic_string_view<char,_std::char_traits<char>_> *)local_48,
                              local_108 + 1);
          if (*pvVar4 == ':') {
            bVar9 = ::std::basic_string_view<char,_std::char_traits<char>_>::substr
                              ((basic_string_view<char,_std::char_traits<char>_> *)local_48,1,
                               local_108 - 1);
            in_00._M_str = bVar9._M_str;
            in_00._M_len = (size_t)in_00._M_str;
            local_130 = bVar9;
            local_120 = strip_string((aux *)bVar9._M_len,in_00);
            ::std::__cxx11::string::operator=
                      ((string *)&port._M_str,
                       (basic_string_view<char,_std::char_traits<char>_> *)&local_120);
            bVar9 = ::std::basic_string_view<char,_std::char_traits<char>_>::substr
                              ((basic_string_view<char,_std::char_traits<char>_> *)local_48,
                               local_108 + 2,0xffffffffffffffff);
            in_01._M_str = bVar9._M_str;
            pos_1 = bVar9._M_len;
            in_01._M_len = (size_t)in_01._M_str;
            local_148 = in_01._M_str;
            local_140 = strip_string((aux *)pos_1,in_01);
            pos = local_140._M_len;
            port._M_len = (size_t)local_140._M_str;
            goto LAB_00660afe;
          }
        }
      }
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)err,
                 (basic_string_view<char,_std::char_traits<char>_> *)local_48);
      local_10c = 2;
    }
    else {
      local_158 = ::std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                            ((basic_string_view<char,_std::char_traits<char>_> *)local_48,':',0);
      bVar9 = ::std::basic_string_view<char,_std::char_traits<char>_>::substr
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_48,0,local_158);
      in_02._M_str = bVar9._M_str;
      in_02._M_len = (size_t)in_02._M_str;
      local_168 = strip_string((aux *)bVar9._M_len,in_02);
      ::std::__cxx11::string::operator=
                ((string *)&port._M_str,
                 (basic_string_view<char,_std::char_traits<char>_> *)&local_168);
      if (local_158 == 0xffffffffffffffff) {
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)err,
                   (basic_string_view<char,_std::char_traits<char>_> *)local_48);
        local_10c = 2;
      }
      else {
        bVar9 = ::std::basic_string_view<char,_std::char_traits<char>_>::substr
                          ((basic_string_view<char,_std::char_traits<char>_> *)local_48,
                           local_158 + 1,0xffffffffffffffff);
        in_03._M_str = bVar9._M_str;
        port_str.field_2._8_8_ = bVar9._M_len;
        in_03._M_len = (size_t)in_03._M_str;
        sVar8 = strip_string((aux *)port_str.field_2._8_8_,in_03);
        local_188 = sVar8._M_len;
        pos = local_188;
        local_180 = sVar8._M_str;
        port._M_len = (size_t)local_180;
LAB_00660afe:
        ::std::__cxx11::string::string((string *)&i);
        local_1c0 = 0;
        while( true ) {
          sVar3 = ::std::basic_string_view<char,_std::char_traits<char>_>::size
                            ((basic_string_view<char,_std::char_traits<char>_> *)&pos);
          local_281 = false;
          if (local_1c0 < sVar3) {
            pvVar4 = ::std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                               ((basic_string_view<char,_std::char_traits<char>_> *)&pos,local_1c0);
            local_281 = is_digit(*pvVar4);
          }
          if (local_281 == false) break;
          pvVar4 = ::std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                             ((basic_string_view<char,_std::char_traits<char>_> *)&pos,local_1c0);
          ::std::__cxx11::string::operator+=((string *)&i,*pvVar4);
          local_1c0 = local_1c0 + 1;
        }
        uVar5 = ::std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          uVar5 = ::std::__cxx11::string::size();
          if (5 < uVar5) goto LAB_00660bff;
          __nptr = (char *)::std::__cxx11::string::c_str();
          iVar2 = atoi(__nptr);
          if ((iVar2 < 0) || (0xffff < iVar2)) {
            ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)err,
                       (basic_string_view<char,_std::char_traits<char>_> *)local_48);
            local_10c = 2;
          }
          else {
            sVar3 = ::std::__cxx11::string::size();
            ::std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                      ((basic_string_view<char,_std::char_traits<char>_> *)&pos,sVar3);
            in_04._M_str = extraout_RDX_00;
            in_04._M_len = port._M_len;
            sVar8 = strip_string((aux *)pos,in_04);
            local_1d0 = sVar8._M_len;
            pos = local_1d0;
            local_1c8 = sVar8._M_str;
            port._M_len = (size_t)local_1c8;
            __end3 = ::std::basic_string_view<char,_std::char_traits<char>_>::begin
                               ((basic_string_view<char,_std::char_traits<char>_> *)&pos);
            pvVar6 = ::std::basic_string_view<char,_std::char_traits<char>_>::end
                               ((basic_string_view<char,_std::char_traits<char>_> *)&pos);
            for (; __end3 != pvVar6; __end3 = __end3 + 1) {
            }
            ::std::
            vector<libtorrent::aux::listen_interface_t,std::allocator<libtorrent::aux::listen_interface_t>>
            ::emplace_back<libtorrent::aux::listen_interface_t&>
                      ((vector<libtorrent::aux::listen_interface_t,std::allocator<libtorrent::aux::listen_interface_t>>
                        *)__return_storage_ptr__,(listen_interface_t *)&port._M_str);
            local_10c = 0;
          }
        }
        else {
LAB_00660bff:
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)err,
                     (basic_string_view<char,_std::char_traits<char>_> *)local_48);
          local_10c = 2;
        }
        ::std::__cxx11::string::~string((string *)&i);
      }
    }
    listen_interface_t::~listen_interface_t((listen_interface_t *)&port._M_str);
  } while( true );
}

Assistant:

std::vector<listen_interface_t> parse_listen_interfaces(std::string const& in
		, std::vector<std::string>& err)
	{
		std::vector<listen_interface_t> out;

		string_view rest = in;
		while (!rest.empty())
		{
			string_view element;
			std::tie(element, rest) = split_string_quotes(rest, ',');

			element = strip_string(element);
			if (element.size() > 1 && element.front() == '"' && element.back() == '"')
				element = element.substr(1, element.size() - 2);
			if (element.empty()) continue;

			listen_interface_t iface;
			iface.ssl = false;
			iface.local = false;

			string_view port;
			if (element.front() == '[')
			{
				auto const pos = element.find_first_of(']', 0);
				if (pos == string_view::npos
					|| pos+1 >= element.size()
					|| element[pos+1] != ':')
				{
					err.emplace_back(element);
					continue;
				}

				iface.device = strip_string(element.substr(1, pos - 1));

				port = strip_string(element.substr(pos + 2));
			}
			else
			{
				// consume device name
				auto const pos = element.find_first_of(':', 0);
				iface.device = strip_string(element.substr(0, pos));
				if (pos == string_view::npos)
				{
					err.emplace_back(element);
					continue;
				}
				port = strip_string(element.substr(pos + 1));
			}

			// consume port
			std::string port_str;
			for (std::size_t i = 0; i < port.size() && is_digit(port[i]); ++i)
				port_str += port[i];

			if (port_str.empty() || port_str.size() > 5)
			{
				err.emplace_back(element);
				continue;
			}

			iface.port = std::atoi(port_str.c_str());
			if (iface.port < 0 || iface.port > 65535)
			{
				err.emplace_back(element);
				continue;
			}

			port.remove_prefix(port_str.size());
			port = strip_string(port);

			// consume potential SSL 's'
			for (auto const c : port)
			{
				switch (c)
				{
					case 's': iface.ssl = true; break;
					case 'l': iface.local = true; break;
				}
			}

			TORRENT_ASSERT(iface.port >= 0);
			out.emplace_back(iface);
		}

		return out;
	}